

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O0

void beltWBLStepEBase(void *buf,size_t count,void *state)

{
  u32 *in_RDX;
  undefined1 *in_RSI;
  undefined8 *in_RDI;
  size_t i;
  word n;
  belt_wbl_st *st;
  void *in_stack_ffffffffffffffc8;
  undefined1 *dest;
  
  do {
    *(undefined8 *)(in_RDX + 8) = *in_RDI;
    *(undefined8 *)(in_RDX + 10) = in_RDI[1];
    for (dest = &DAT_00000010; dest + 0x10 < in_RSI; dest = dest + 0x10) {
      *(ulong *)(in_RDX + 8) = *(ulong *)((long)in_RDI + (long)dest) ^ *(ulong *)(in_RDX + 8);
      *(ulong *)(in_RDX + 10) =
           *(ulong *)((long)(in_RDI + 1) + (long)dest) ^ *(ulong *)(in_RDX + 10);
    }
    memMove(dest,in_stack_ffffffffffffffc8,0x14167e);
    *(undefined8 *)((long)in_RDI + (long)(in_RSI + -0x10)) = *(undefined8 *)(in_RDX + 8);
    *(undefined8 *)((long)in_RDI + (long)(in_RSI + -8)) = *(undefined8 *)(in_RDX + 10);
    beltBlockEncr((octet *)(in_RDX + 8),in_RDX);
    *(long *)(in_RDX + 0x10) = *(long *)(in_RDX + 0x10) + 1;
    memXor2(in_RDX + 8,in_RDX + 0x10,8);
    *(ulong *)((long)in_RDI + (long)(in_RSI + -0x20)) =
         *(ulong *)(in_RDX + 8) ^ *(ulong *)((long)in_RDI + (long)(in_RSI + -0x20));
    *(ulong *)((long)in_RDI + (long)(in_RSI + -0x18)) =
         *(ulong *)(in_RDX + 10) ^ *(ulong *)((long)in_RDI + (long)(in_RSI + -0x18));
  } while (*(ulong *)(in_RDX + 0x10) % (((ulong)(in_RSI + 0xf) >> 4) << 1) != 0);
  return;
}

Assistant:

void beltWBLStepEBase(void* buf, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	ASSERT(count >= 32);
	ASSERT(memIsDisjoint2(buf, count, state, beltWBL_keep()));
	ASSERT(st->round % (2 * n) == 0);
	do
	{
		size_t i;
		// block <- r1 + ... + r_{n-1}
		beltBlockCopy(st->block, buf);
		for (i = 16; i + 16 < count; i += 16)
			beltBlockXor2(st->block, (octet*)buf + i);
		// r <- ShLo^128(r)
		memMove(buf, (octet*)buf + 16, count - 16);
		// r* <- block
		beltBlockCopy((octet*)buf + count - 16, st->block);
		// block <- beltBlockEncr(block) + <round>
		beltBlockEncr(st->block, st->key);
		st->round++;
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r*_до_сдвига <- r*_до_сдвига + block
		beltBlockXor2((octet*)buf + count - 32, st->block);
	}
	while (st->round % (2 * n));
}